

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O0

int csp_zmqhub_init_w_endpoints
              (uint16_t addr,char *publisher_endpoint,char *subscriber_endpoint,uint32_t flags,
              csp_iface_t **return_interface)

{
  int iVar1;
  undefined2 in_DI;
  char *unaff_retaddr;
  uint in_stack_0000000c;
  uint16_t *in_stack_00000010;
  uint rxfilter_count;
  uint16_t *rxfilter;
  undefined6 in_stack_fffffffffffffff8;
  
  iVar1 = csp_zmqhub_init_w_name_endpoints_rxfilter
                    ((char *)return_interface,rxfilter._6_2_,in_stack_00000010,in_stack_0000000c,
                     unaff_retaddr,(char *)CONCAT26(in_DI,in_stack_fffffffffffffff8),
                     (uint32_t)subscriber_endpoint,(csp_iface_t **)publisher_endpoint);
  return iVar1;
}

Assistant:

int csp_zmqhub_init_w_endpoints(uint16_t addr,
								const char * publisher_endpoint,
								const char * subscriber_endpoint,
								uint32_t flags,
								csp_iface_t ** return_interface) {

	uint16_t * rxfilter = NULL;
	unsigned int rxfilter_count = 0;

	return csp_zmqhub_init_w_name_endpoints_rxfilter(NULL, addr,
													 rxfilter, rxfilter_count,
													 publisher_endpoint,
													 subscriber_endpoint,
													 flags,
													 return_interface);
}